

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void aura_hexdump(char *desc,void *addr,int len)

{
  uchar uVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  uchar buff [17];
  
  if (desc != (char *)0x0) {
    printf("%s:\n",desc);
  }
  if (len < 1) {
    len = 0;
  }
  uVar2 = (ulong)(uint)len;
  bVar4 = -(char)len;
  for (uVar3 = 0; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if ((uVar3 & 0xf) == 0) {
      if (uVar3 != 0) {
        printf("  %s\n",buff);
      }
      printf("  %04x ",uVar3 & 0xffffffff);
    }
    printf(" %02x",(ulong)*(byte *)((long)addr + uVar3));
    uVar1 = *(uchar *)((long)addr + uVar3);
    if ((byte)(uVar1 + 0x81) < 0xa1) {
      uVar1 = '.';
    }
    buff[(uint)uVar3 & 0xf] = uVar1;
    buff[(uVar3 & 0xf) + 1] = '\0';
    bVar4 = bVar4 + 1;
  }
  for (; (bVar4 & 0xf) != ((byte)uVar2 & 0xf); uVar2 = (ulong)((int)uVar2 + 1)) {
    printf("   ");
  }
  printf("  %s\n",buff);
  return;
}

Assistant:

void aura_hexdump(char *desc, void *addr, int len)
{
	int i;
	unsigned char buff[17];
	unsigned char *pc = (unsigned char *)addr;

	if (desc != NULL)
		printf("%s:\n", desc);

	for (i = 0; i < len; i++) {
		if ((i % 16) == 0) {
			if (i != 0)
				printf("  %s\n", buff);
			printf("  %04x ", i);
		}

		printf(" %02x", pc[i]);
		if ((pc[i] < 0x20) || (pc[i] > 0x7e))
			buff[i % 16] = '.';
		else
			buff[i % 16] = pc[i];
		buff[(i % 16) + 1] = '\0';
	}

	while ((i % 16) != 0) {
		printf("   ");
		i++;
	}

	printf("  %s\n", buff);
}